

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

int N_VScaleAddMulti(int nvec,realtype *a,N_Vector x,N_Vector *Y,N_Vector *Z)

{
  realtype ONE;
  int i;
  N_Vector *Z_local;
  N_Vector *Y_local;
  N_Vector x_local;
  realtype *a_local;
  int nvec_local;
  
  if (x->ops->nvscaleaddmulti ==
      (_func_int_int_realtype_ptr_N_Vector_N_Vector_ptr_N_Vector_ptr *)0x0) {
    for (ONE._4_4_ = 0; ONE._4_4_ < nvec; ONE._4_4_ = ONE._4_4_ + 1) {
      (*x->ops->nvlinearsum)(a[ONE._4_4_],x,1.0,Y[ONE._4_4_],Z[ONE._4_4_]);
    }
    a_local._4_4_ = 0;
  }
  else {
    a_local._4_4_ = (*x->ops->nvscaleaddmulti)(nvec,a,x,Y,Z);
  }
  return a_local._4_4_;
}

Assistant:

int N_VScaleAddMulti(int nvec, realtype* a, N_Vector x, N_Vector* Y, N_Vector* Z)
{
  int i;
  realtype ONE=RCONST(1.0);

  if (x->ops->nvscaleaddmulti != NULL) {
    
    return(x->ops->nvscaleaddmulti(nvec, a, x, Y, Z));

  } else {

    for (i=0; i<nvec; i++) {
      x->ops->nvlinearsum(a[i], x, ONE, Y[i], Z[i]);
    }
    return(0);

  }
}